

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O3

float __thiscall
Assimp::X3DImporter::XML_ReadNode_GetAttrVal_AsFloat(X3DImporter *this,int pAttrIdx)

{
  FIReader *pFVar1;
  int iVar2;
  long lVar3;
  undefined4 extraout_var;
  runtime_error *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  X3DImporter *this_01;
  long lVar5;
  float fVar6;
  float tvalf;
  string val;
  float local_4c;
  string local_48;
  
  pFVar1 = (this->mReader)._M_t.
           super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
           super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
           super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
  (*(pFVar1->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0x12])
            (&local_48,pFVar1,pAttrIdx);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    lVar5 = 0;
  }
  else {
    lVar3 = __dynamic_cast(local_48._M_dataplus._M_p,&FIValue::typeinfo,&FIFloatValue::typeinfo,0);
    p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    lVar5 = 0;
    if (lVar3 != 0) {
      lVar5 = lVar3;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._M_string_length ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._M_string_length;
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_48._M_string_length + 8) =
               *(_Atomic_word *)(local_48._M_string_length + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_48._M_string_length + 8) =
               *(_Atomic_word *)(local_48._M_string_length + 8) + 1;
        }
      }
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._M_string_length);
  }
  if (lVar5 == 0) {
    local_48._M_string_length = 0;
    local_48.field_2._M_local_buf[0] = '\0';
    this_01 = (X3DImporter *)
              (this->mReader)._M_t.
              super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
              super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
              super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    iVar2 = (*(this_01->super_BaseImporter)._vptr_BaseImporter[6])(this_01,pAttrIdx);
    ParseHelper_FixTruncatedFloatString(this_01,(char *)CONCAT44(extraout_var,iVar2),&local_48);
    fast_atoreal_move<float>(local_48._M_dataplus._M_p,&local_4c,false);
    fVar6 = local_4c;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,
                      CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                               local_48.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    if (*(long *)(lVar5 + 0x10) - (long)*(float **)(lVar5 + 8) != 4) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Invalid float value","");
      std::runtime_error::runtime_error(this_00,(string *)&local_48);
      *(undefined ***)this_00 = &PTR__runtime_error_007dd738;
      __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    fVar6 = **(float **)(lVar5 + 8);
  }
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  return fVar6;
}

Assistant:

float X3DImporter::XML_ReadNode_GetAttrVal_AsFloat(const int pAttrIdx)
{
    auto floatValue = std::dynamic_pointer_cast<const FIFloatValue>(mReader->getAttributeEncodedValue(pAttrIdx));
    if (floatValue) {
        if (floatValue->value.size() == 1) {
            return floatValue->value.front();
        }
        throw DeadlyImportError("Invalid float value");
    }
    else {
        std::string val;
        float tvalf;

        ParseHelper_FixTruncatedFloatString(mReader->getAttributeValue(pAttrIdx), val);
        fast_atoreal_move(val.c_str(), tvalf, false);

        return tvalf;
    }
}